

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.h
# Opt level: O0

string * __thiscall
bandit::colorizer::light::bad_abi_cxx11_(string *__return_storage_ptr__,light *this)

{
  light *this_local;
  
  backend::red_abi_cxx11_(__return_storage_ptr__,(backend *)this);
  return __return_storage_ptr__;
}

Assistant:

const std::string bad() const override {
        return red();
      }